

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O1

void GPU_PrimitiveBatchV(GPU_Image *image,GPU_Target *target,GPU_PrimitiveEnum primitive_type,
                        unsigned_short num_vertices,void *values,uint num_indices,
                        unsigned_short *indices,GPU_BatchFlagEnum flags)

{
  char *pcVar1;
  GPU_ErrorEnum error;
  
  if (_gpu_current_renderer == (GPU_Renderer *)0x0) {
    pcVar1 = "NULL renderer";
  }
  else {
    if (((target != (GPU_Target *)0x0) &&
        (_gpu_current_renderer->current_context_target == (GPU_Target *)0x0)) &&
       (target->context != (GPU_Context *)0x0)) {
      (*_gpu_current_renderer->impl->MakeCurrent)
                (_gpu_current_renderer,target,target->context->windowID);
    }
    if (_gpu_current_renderer->current_context_target != (GPU_Target *)0x0) {
      if (target != (GPU_Target *)0x0) {
        if (num_vertices != 0) {
          (*_gpu_current_renderer->impl->PrimitiveBatchV)
                    (_gpu_current_renderer,image,target,primitive_type,num_vertices,values,
                     num_indices,indices,flags);
        }
        return;
      }
      pcVar1 = "target";
      error = GPU_ERROR_NULL_ARGUMENT;
      goto LAB_001384c6;
    }
    pcVar1 = "NULL context";
  }
  error = GPU_ERROR_USER_ERROR;
LAB_001384c6:
  GPU_PushErrorCode("GPU_PrimitiveBatchV",error,"%s",pcVar1);
  return;
}

Assistant:

void GPU_PrimitiveBatchV(GPU_Image* image, GPU_Target* target, GPU_PrimitiveEnum primitive_type, unsigned short num_vertices, void* values, unsigned int num_indices, unsigned short* indices, GPU_BatchFlagEnum flags)
{
    if(!CHECK_RENDERER)
        RETURN_ERROR(GPU_ERROR_USER_ERROR, "NULL renderer");
    MAKE_CURRENT_IF_NONE(target);
    if(!CHECK_CONTEXT)
        RETURN_ERROR(GPU_ERROR_USER_ERROR, "NULL context");

    if(target == NULL)
        RETURN_ERROR(GPU_ERROR_NULL_ARGUMENT, "target");

    if(num_vertices == 0)
        return;


    _gpu_current_renderer->impl->PrimitiveBatchV(_gpu_current_renderer, image, target, primitive_type, num_vertices, values, num_indices, indices, flags);
}